

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  cmMakefile *this_00;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *this_01;
  reference this_02;
  pointer pcVar4;
  reference puVar5;
  pointer pcVar6;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_5;
  iterator __end1_5;
  iterator __begin1_5;
  LocalGeneratorVector *__range1_5;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_4;
  iterator __end1_4;
  iterator __begin1_4;
  LocalGeneratorVector *__range1_4;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_3;
  iterator __end1_3;
  iterator __begin1_3;
  LocalGeneratorVector *__range1_3;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *g;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range2;
  cmMakefile *mf;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_2;
  iterator __end1_2;
  iterator __begin1_2;
  LocalGeneratorVector *__range1_2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_1;
  iterator __end1_1;
  iterator __begin1_1;
  LocalGeneratorVector *__range1_1;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_DEFAULT_BUILD_TYPE",&local_39);
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x34])();
  bVar1 = UnsupportedVariableIsDefined(this,&local_38,(bool)((byte)iVar2 & 1));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_CROSS_CONFIGS",&local_71);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x35])();
    bVar1 = UnsupportedVariableIsDefined(this,&local_70,(bool)((byte)iVar2 & 1));
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_DEFAULT_CONFIGS",
                 (allocator<char> *)((long)&__range1 + 7));
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x36])();
      bVar1 = UnsupportedVariableIsDefined(this,&local_98,(bool)((byte)iVar2 & 1));
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = (*this->_vptr_cmGlobalGenerator[0xd])();
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->FilesReplacedDuringGenerate);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->CMP0042WarnTargets);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->CMP0068WarnTargets);
          uVar3 = (*this->_vptr_cmGlobalGenerator[0x3c])();
          if ((uVar3 & 1) == 0) {
            this_local._7_1_ = false;
          }
          else {
            FinalizeTargetConfiguration(this);
            CreateGenerationObjects(this,AllTargets);
            FillProjectMap(this);
            bVar1 = AddAutomaticSources(this);
            if (bVar1) {
              bVar1 = AddHeaderSetVerification(this);
              if (bVar1) {
                bVar1 = QtAutoGen(this);
                if (bVar1) {
                  __end1 = std::
                           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ::begin(&this->LocalGenerators);
                  localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *
                             )std::
                              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                              ::end(&this->LocalGenerators);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end1,(
                                                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                                  *)&localGen), bVar1) {
                    puVar5 = __gnu_cxx::
                             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             ::operator*(&__end1);
                    pcVar6 = std::
                             unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                             operator->(puVar5);
                    (*pcVar6->_vptr_cmLocalGenerator[4])();
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                    ::operator++(&__end1);
                  }
                  __end1_1 = std::
                             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                             ::begin(&this->LocalGenerators);
                  localGen_1 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                *)std::
                                  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                  ::end(&this->LocalGenerators);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end1_1,
                                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                             *)&localGen_1), bVar1) {
                    puVar5 = __gnu_cxx::
                             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             ::operator*(&__end1_1);
                    pcVar6 = std::
                             unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                             operator->(puVar5);
                    bVar1 = cmLocalGenerator::ComputeTargetCompileFeatures(pcVar6);
                    if (!bVar1) {
                      return false;
                    }
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                    ::operator++(&__end1_1);
                  }
                  __end1_2 = std::
                             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                             ::begin(&this->LocalGenerators);
                  localGen_2 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                *)std::
                                  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                  ::end(&this->LocalGenerators);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end1_2,
                                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                             *)&localGen_2), bVar1) {
                    puVar5 = __gnu_cxx::
                             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             ::operator*(&__end1_2);
                    pcVar6 = std::
                             unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                             operator->(puVar5);
                    this_00 = cmLocalGenerator::GetMakefile(pcVar6);
                    this_01 = cmMakefile::GetInstallGenerators(this_00);
                    __end2 = std::
                             vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                             ::begin(this_01);
                    g = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        std::
                        vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                        ::end(this_01);
                    while (bVar1 = __gnu_cxx::operator!=
                                             (&__end2,(
                                                  __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                                                  *)&g), bVar1) {
                      this_02 = __gnu_cxx::
                                __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                                ::operator*(&__end2);
                      pcVar4 = std::
                               unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                               ::operator->(this_02);
                      pcVar6 = std::
                               unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               ::get(puVar5);
                      uVar3 = (*(pcVar4->super_cmScriptGenerator)._vptr_cmScriptGenerator[10])
                                        (pcVar4,pcVar6);
                      if ((uVar3 & 1) == 0) {
                        return false;
                      }
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                      ::operator++(&__end2);
                    }
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                    ::operator++(&__end1_2);
                  }
                  (*this->_vptr_cmGlobalGenerator[0xe])();
                  __end1_3 = std::
                             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                             ::begin(&this->LocalGenerators);
                  localGen_3 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                *)std::
                                  vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                  ::end(&this->LocalGenerators);
                  while (bVar1 = __gnu_cxx::operator!=
                                           (&__end1_3,
                                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                             *)&localGen_3), bVar1) {
                    puVar5 = __gnu_cxx::
                             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             ::operator*(&__end1_3);
                    pcVar6 = std::
                             unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                             operator->(puVar5);
                    cmLocalGenerator::TraceDependencies(pcVar6);
                    __gnu_cxx::
                    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                    ::operator++(&__end1_3);
                  }
                  bVar1 = CheckTargetsForMissingSources(this);
                  if (bVar1) {
                    this_local._7_1_ = false;
                  }
                  else {
                    (*this->_vptr_cmGlobalGenerator[0x3e])();
                    __end1_4 = std::
                               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                               ::begin(&this->LocalGenerators);
                    localGen_4 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                  *)std::
                                    vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                    ::end(&this->LocalGenerators);
                    while (bVar1 = __gnu_cxx::operator!=
                                             (&__end1_4,
                                              (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                               *)&localGen_4), bVar1) {
                      puVar5 = __gnu_cxx::
                               __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                               ::operator*(&__end1_4);
                      pcVar6 = std::
                               unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                               ::operator->(puVar5);
                      cmLocalGenerator::ComputeTargetManifest(pcVar6);
                      __gnu_cxx::
                      __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                      ::operator++(&__end1_4);
                    }
                    uVar3 = (*this->_vptr_cmGlobalGenerator[0x3b])();
                    if ((uVar3 & 1) == 0) {
                      this_local._7_1_ = false;
                    }
                    else {
                      ComputeTargetOrder(this);
                      bVar1 = CheckTargetsForType(this);
                      if (bVar1) {
                        this_local._7_1_ = false;
                      }
                      else {
                        bVar1 = CheckTargetsForPchCompilePdb(this);
                        if (bVar1) {
                          this_local._7_1_ = false;
                        }
                        else {
                          __end1_5 = std::
                                     vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                     ::begin(&this->LocalGenerators);
                          localGen_5 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                        *)std::
                                          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                          ::end(&this->LocalGenerators);
                          while (bVar1 = __gnu_cxx::operator!=
                                                   (&__end1_5,
                                                    (
                                                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                                  *)&localGen_5), bVar1) {
                            puVar5 = __gnu_cxx::
                                     __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     ::operator*(&__end1_5);
                            pcVar6 = std::
                                     unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                     ::operator->(puVar5);
                            (*pcVar6->_vptr_cmLocalGenerator[3])();
                            __gnu_cxx::
                            __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                            ::operator++(&__end1_5);
                          }
                          this_local._7_1_ = true;
                        }
                      }
                    }
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Make sure unsupported variables are not used.
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_BUILD_TYPE",
                                         this->SupportsDefaultBuildType())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_CROSS_CONFIGS",
                                         this->SupportsCrossConfigs())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_CONFIGS",
                                         this->SupportsDefaultConfigs())) {
    return false;
  }
  if (!this->InspectConfigTypeVariables()) {
    return false;
  }

  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetConfiguration();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Add automatically generated sources (e.g. unity build).
  if (!this->AddAutomaticSources()) {
    return false;
  }

  // Iterate through all targets and add verification targets for header sets
  if (!this->AddHeaderSetVerification()) {
    return false;
  }

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (const auto& localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Perform up-front computation in order to handle errors (such as unknown
  // features) at this point. While processing the compile features we also
  // calculate and cache the language standard required by the compile
  // features.
  for (const auto& localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (const auto& localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (const auto& g : mf->GetInstallGenerators()) {
      if (!g->Compute(localGen.get())) {
        return false;
      }
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (const auto& localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }
  this->ComputeTargetOrder();

  if (this->CheckTargetsForType()) {
    return false;
  }

  if (this->CheckTargetsForPchCompilePdb()) {
    return false;
  }

  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}